

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
common::
make_map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>
::make_map(make_map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>
           *this,int *key,
          map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
          *val)

{
  mapped_type *this_00;
  map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
  *val_local;
  int *key_local;
  make_map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>
  *this_local;
  
  std::
  map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
  ::map(&this->map);
  this_00 = std::
            map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
            ::operator[](&this->map,key);
  std::
  map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
  ::operator=(this_00,val);
  return;
}

Assistant:

make_map(K const& key, V const& val) {
            map[key] = val;
        }